

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc_conflict to_avoid;
  loc_conflict grid_00;
  loc grid_01;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  level_conflict *lev_00;
  char *pcVar5;
  chunk_conflict *source;
  chunk *c;
  level_conflict *lev_01;
  char *pcVar6;
  feature *pfVar7;
  wchar_t local_88;
  uint local_80;
  _Bool found;
  level *last_lev;
  loc door_1;
  loc door;
  wchar_t feat;
  town *town;
  chunk_conflict *c_old;
  chunk_conflict *c_new;
  char *name;
  level *lev;
  wchar_t residents;
  loc grid;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  _Var3 = is_daytime();
  if (_Var3) {
    uVar1 = z_info->town_monsters_day;
  }
  else {
    uVar1 = z_info->town_monsters_night;
  }
  local_80 = (uint)uVar1;
  lev_00 = world->levels + p->place;
  pcVar5 = level_name(lev_00);
  source = chunk_find_name(pcVar5);
  stack0xffffffffffffffa8 = (town *)0x0;
  grid.x = 0;
  while ((grid.x < world->num_towns &&
         (register0x00000000 = (town *)(world->towns + grid.x),
         register0x00000000->index != (int)p->place))) {
    grid.x = grid.x + 1;
  }
  if (world->num_towns <= grid.x) {
    __assert_fail("i < world->num_towns",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                  ,0xb25,"struct chunk *town_gen(struct player *, int, int, const char **)");
  }
  if (stack0xffffffffffffffa8->num_stores < L'\x05') {
    local_88 = z_info->town_wid / 2;
  }
  else {
    local_88 = (wchar_t)z_info->town_wid;
  }
  c = (chunk *)cave_new((uint)z_info->town_hgt,local_88);
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)p->depth;
    c->place = (int)p->place;
    town_gen_layout((chunk_conflict *)c,p,stack0xffffffffffffffa8);
    goto LAB_0015d756;
  }
  door.x = FEAT_MORE;
  c->depth = source->depth;
  c->place = (int)p->place;
  _Var3 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
  if (!_Var3) {
    quit_fmt("chunk_copy() level bounds failed!");
  }
  chunk_list_remove(pcVar5);
  cave_free(source);
  if ((p->place == p->home) && (_Var3 = find_home((chunk_conflict *)c,&door_1), !_Var3)) {
    build_new_house((chunk_conflict *)c);
  }
  if ((p->place != p->home) &&
     (_Var3 = find_home((chunk_conflict *)c,(loc *)((long)&last_lev + 4)), _Var3)) {
    demolish_house((chunk_conflict *)c,stack0xffffffffffffff94);
  }
  pcVar5 = strstr(world->name,"Wilderness");
  if (pcVar5 != (char *)0x0) {
    lev_01 = world->levels + p->last_place;
    if (lev_00->north == (char *)0x0) {
LAB_0015d58e:
      if (lev_00->east != (char *)0x0) {
        pcVar5 = lev_00->east;
        pcVar6 = level_name(lev_01);
        iVar4 = strcmp(pcVar5,pcVar6);
        if (iVar4 == 0) {
          door.x = FEAT_MORE_EAST;
          goto LAB_0015d664;
        }
      }
      if (lev_00->south != (char *)0x0) {
        pcVar5 = lev_00->south;
        pcVar6 = level_name(lev_01);
        iVar4 = strcmp(pcVar5,pcVar6);
        if (iVar4 == 0) {
          door.x = FEAT_MORE_SOUTH;
          goto LAB_0015d664;
        }
      }
      if (lev_00->west != (char *)0x0) {
        pcVar5 = lev_00->west;
        pcVar6 = level_name(lev_01);
        iVar4 = strcmp(pcVar5,pcVar6);
        if (iVar4 == 0) {
          door.x = FEAT_MORE_WEST;
        }
      }
    }
    else {
      pcVar5 = lev_00->north;
      pcVar6 = level_name(lev_01);
      iVar4 = strcmp(pcVar5,pcVar6);
      if (iVar4 != 0) goto LAB_0015d58e;
      door.x = FEAT_MORE_NORTH;
    }
LAB_0015d664:
    if (door.x == FEAT_MORE) {
      if (lev_00->north == (char *)0x0) {
        if (lev_00->east == (char *)0x0) {
          if (lev_00->south == (char *)0x0) {
            if (lev_00->west != (char *)0x0) {
              door.x = FEAT_MORE_WEST;
            }
          }
          else {
            door.x = FEAT_MORE_SOUTH;
          }
        }
        else {
          door.x = FEAT_MORE_EAST;
        }
      }
      else {
        door.x = FEAT_MORE_NORTH;
      }
    }
  }
  for (residents = L'\0'; residents < c->height; residents = residents + L'\x01') {
    bVar2 = false;
    for (lev._4_4_ = L'\0'; lev._4_4_ < c->width; lev._4_4_ = lev._4_4_ + L'\x01') {
      grid_00.y = residents;
      grid_00.x = lev._4_4_;
      pfVar7 = square_feat(c,grid_00);
      if (pfVar7->fidx == door.x) {
        bVar2 = true;
        break;
      }
    }
    if (bVar2) break;
  }
  grid_01.y = residents;
  grid_01.x = lev._4_4_;
  player_place((chunk_conflict1 *)c,p,grid_01);
LAB_0015d756:
  _Var3 = is_daytime();
  cave_illuminate(c,_Var3);
  for (grid.x = 0; grid.x < (int)local_80; grid.x = grid.x + 1) {
    to_avoid.x = (p->grid).x;
    to_avoid.y = (p->grid).y;
    pick_and_place_distant_monster(c,to_avoid,L'\x03',true,c->depth);
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct level *lev = &world->levels[p->place];
	char *name = level_name(lev);
	struct chunk *c_new, *c_old = chunk_find_name(name);
	struct town *town = NULL;

	/* Find the town */
	for (i = 0; i < world->num_towns; i++) {
		town = &world->towns[i];
		if (town->index == p->place) break;
	}
	assert (i < world->num_towns);

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, town->num_stores > 4 ?
					 z_info->town_wid : z_info->town_wid / 2);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;
		c_new->place = p->place;

		/* Build stuff */
		town_gen_layout(c_new, p, town);
	} else {
		int feat = FEAT_MORE;

		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		c_new->place = p->place;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove(name);
		cave_free(c_old);

		/* Build a new house if needed */
		if (p->place == p->home) {
			struct loc door;
			if (!find_home(c_new, &door)) {
				build_new_house(c_new);
			}
		}

		/* Demolish an old house if needed */
		if (p->place != p->home) {
			struct loc door;
			if (find_home(c_new, &door)) {
				demolish_house(c_new, door);
			}
		}

		/* Get the correct path for wilderness */
		if (strstr(world->name, "Wilderness")) {
			struct level *last_lev = &world->levels[p->last_place];
			if (lev->north && streq(lev->north, level_name(last_lev))) {
				feat = FEAT_MORE_NORTH;
			} else if (lev->east && streq(lev->east, level_name(last_lev))) {
				feat = FEAT_MORE_EAST;
			} else if (lev->south && streq(lev->south, level_name(last_lev))) {
				feat = FEAT_MORE_SOUTH;
			} else if (lev->west && streq(lev->west, level_name(last_lev))) {
				feat = FEAT_MORE_WEST;
			}

			/* Deal with recall */
			if (feat == FEAT_MORE) {
				if (lev->north) {
				feat = FEAT_MORE_NORTH;
				} else if (lev->east) {
					feat = FEAT_MORE_EAST;
				} else if (lev->south) {
					feat = FEAT_MORE_SOUTH;
				} else if (lev->west) {
					feat = FEAT_MORE_WEST;
				}
			}
		}

		/* Find the required stair/path */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == feat) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}